

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  __type _Var1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FileDescriptor *this;
  iterator this_00;
  iterator text;
  ulong uVar6;
  ulong uVar7;
  FileDescriptorProto *in_RDX;
  byte in_SIL;
  FileDescriptor *in_RDI;
  bool in_stack_00000047;
  FileDescriptor *in_stack_00000048;
  int i_3;
  string files_data;
  iterator it_1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *message_type;
  iterator it;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency;
  FileDescriptorProto *file_proto;
  FileDescriptorSet files;
  string dependency_filename;
  string *name;
  int i_2;
  int i_1;
  int i;
  Printer *in_stack_00000300;
  Descriptor *in_stack_00000308;
  string *in_stack_00000310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  FileDescriptorSet *in_stack_fffffffffffffdb0;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb8;
  FileDescriptor *in_stack_fffffffffffffdc0;
  const_iterator in_stack_fffffffffffffdc8;
  FileDescriptorSet *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffde8;
  iterator in_stack_fffffffffffffdf8;
  Printer *in_stack_fffffffffffffe00;
  reference in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  FileDescriptorProto *in_stack_fffffffffffffe48;
  int iVar8;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe68;
  EnumDescriptor *in_stack_fffffffffffffe70;
  string local_188 [32];
  string local_168 [36];
  int local_144;
  string local_140 [32];
  iterator local_120;
  RepeatedPtrIterator<google::protobuf::DescriptorProto> local_118;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_110;
  void **local_108;
  RepeatedPtrIterator<std::__cxx11::string_const> local_100 [8];
  iterator local_f8;
  RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  Printer *local_e8;
  FileDescriptorProto *local_e0;
  string local_a8 [32];
  string local_88 [32];
  string *local_68;
  int local_5c;
  int local_58;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  FileDescriptorProto *local_18;
  byte local_9;
  FileDescriptor *local_8;
  
  local_9 = in_SIL & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
  Indent((Printer *)0x4a8144);
  io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
  if ((local_9 & 1) == 0) {
    local_5c = 0;
    while (iVar8 = local_5c, iVar4 = FileDescriptor::dependency_count(local_8), iVar8 < iVar4) {
      this = FileDescriptor::dependency
                       (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      local_68 = FileDescriptor::name_abi_cxx11_(this);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdd0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdc8.it_);
      if (!_Var1) {
        FileDescriptor::dependency
                  (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        GeneratedMetadataFileName_abi_cxx11_(in_stack_00000048,in_stack_00000047);
        in_stack_fffffffffffffe48 = local_18;
        FilenameToClassname(in_stack_fffffffffffffde8);
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   (char *)in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->variable_delimiter_
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffdf8.it_);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_88);
      }
      local_5c = local_5c + 1;
    }
    FileDescriptorSet::FileDescriptorSet(in_stack_fffffffffffffdd0);
    local_e0 = FileDescriptorSet::add_file((FileDescriptorSet *)0x4a84a1);
    FileDescriptor::CopyTo
              ((FileDescriptor *)CONCAT44(in_stack_fffffffffffffe54,iVar8),in_stack_fffffffffffffe48
              );
    local_e8 = (Printer *)FileDescriptorProto::mutable_dependency_abi_cxx11_(local_e0);
    this_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffda8);
    local_f0.it_ = this_00.it_;
    while( true ) {
      text = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::end(in_stack_fffffffffffffdb8);
      local_f8.it_ = text.it_;
      uVar2 = internal::
              RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator!=(&local_f0,&local_f8);
      if (!(bool)uVar2) break;
      in_stack_fffffffffffffe08 =
           internal::
           RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_f0);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (bVar3) {
        in_stack_fffffffffffffe00 = local_e8;
        internal::RepeatedPtrIterator<std::__cxx11::string_const>::
        RepeatedPtrIterator<std::__cxx11::string>(local_100,&local_f0);
        in_stack_fffffffffffffdf8 =
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::erase((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
        local_108 = in_stack_fffffffffffffdf8.it_;
        break;
      }
      internal::
      RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_f0);
    }
    FileDescriptorProto::clear_extension((FileDescriptorProto *)0x4a8616);
    local_110 = FileDescriptorProto::mutable_message_type(local_e0);
    local_118.it_ =
         (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::begin
                            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
                             in_stack_fffffffffffffda8);
    while( true ) {
      local_120.it_ =
           (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::end
                              ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
                               in_stack_fffffffffffffdb8);
      bVar3 = internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator!=
                        (&local_118,&local_120);
      if (!bVar3) break;
      internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator->
                ((RepeatedPtrIterator<google::protobuf::DescriptorProto> *)0x4a86ad);
      DescriptorProto::clear_extension((DescriptorProto *)0x4a86be);
      internal::RepeatedPtrIterator<google::protobuf::DescriptorProto>::operator++(&local_118);
    }
    std::__cxx11::string::string(local_140);
    MessageLite::SerializeToString
              ((MessageLite *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
    Indent((Printer *)0x4a871c);
    local_144 = 0;
    while( true ) {
      uVar6 = (ulong)local_144;
      uVar7 = std::__cxx11::string::size();
      if (uVar7 <= uVar6) break;
      std::__cxx11::string::substr((ulong)local_188,(ulong)local_140);
      BinaryToHex(in_stack_fffffffffffffe08);
      in_stack_fffffffffffffdb0 = (FileDescriptorSet *)(long)(local_144 + 0x1e);
      std::__cxx11::string::size();
      io::Printer::Print<char[5],std::__cxx11::string,char[4],char_const*>
                ((Printer *)this_00.it_,(char *)text.it_,
                 (char (*) [5])CONCAT17(uVar2,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08,
                 &in_stack_fffffffffffffe00->variable_delimiter_,
                 (char **)in_stack_fffffffffffffdf8.it_);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_188);
      local_144 = local_144 + 0x1e;
    }
    Outdent((Printer *)0x4a88ac);
    io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
    std::__cxx11::string::~string(local_140);
    FileDescriptorSet::~FileDescriptorSet(in_stack_fffffffffffffdb0);
  }
  else {
    local_1c = 0;
    while (iVar8 = local_1c, iVar4 = FileDescriptor::message_type_count(local_8), iVar8 < iVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      FileDescriptor::message_type(local_8,local_1c);
      GenerateMessageToPool(in_stack_00000310,in_stack_00000308,in_stack_00000300);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      local_1c = local_1c + 1;
    }
    local_58 = 0;
    while (iVar4 = local_58, iVar5 = FileDescriptor::enum_type_count(local_8), iVar4 < iVar5) {
      FileDescriptor::enum_type(local_8,local_58);
      GenerateEnumToPool(in_stack_fffffffffffffe70,
                         (Printer *)CONCAT44(iVar8,in_stack_fffffffffffffe68));
      local_58 = local_58 + 1;
    }
    io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
  }
  io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
  Outdent((Printer *)0x4a891d);
  io::Printer::Print<>(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8.it_);
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(file->dependency(i), is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "), true);\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}